

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.h
# Opt level: O3

longlong __thiscall BigInt::operator%(BigInt *this,longlong val)

{
  pair<BigInt,_long_long> local_30;
  
  divModValue(&local_30,this,val);
  if (local_30.first.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.first.vector_value.
                    super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return local_30.second;
}

Assistant:

long long operator%(long long val) const { //! divide by val
        return divModValue(val).second;
    }